

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O2

int run_test_timer(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  uv_timer_t *handle;
  char *pcVar4;
  char *pcVar5;
  uint64_t uVar6;
  char *pcVar7;
  int64_t eval_b_3;
  int64_t eval_b_5;
  uv_timer_t never;
  uv_timer_t repeat;
  uv_timer_t once_timers [10];
  
  puVar2 = uv_default_loop();
  start_time = uv_now(puVar2);
  once_timers[0].data = (void *)0x0;
  repeat.data = (void *)start_time;
  if ((long)start_time < 1) {
    pcVar5 = "start_time";
    pcVar4 = "0";
    uVar3 = 0x7b;
    pcVar7 = "<";
    eval_b_3 = 0;
    eval_b_5 = start_time;
  }
  else {
    handle = once_timers;
    for (uVar6 = 0; uVar6 != 500; uVar6 = uVar6 + 0x32) {
      puVar2 = uv_default_loop();
      iVar1 = uv_timer_init(puVar2,handle);
      repeat.data = (void *)(long)iVar1;
      never.data = (void *)0x0;
      if (repeat.data != (void *)0x0) {
        uVar3 = 0x81;
LAB_00197a02:
        never.data = (void *)0x0;
        pcVar5 = "0";
        pcVar4 = "r";
        pcVar7 = "==";
        eval_b_3 = (int64_t)repeat.data;
        eval_b_5 = (int64_t)(void *)0x0;
        goto LAB_00197a11;
      }
      iVar1 = uv_timer_start(handle,once_cb,uVar6,0);
      repeat.data = (void *)(long)iVar1;
      never.data = (void *)0x0;
      if (repeat.data != (void *)0x0) {
        uVar3 = 0x83;
        goto LAB_00197a02;
      }
      handle = handle + 1;
    }
    puVar2 = uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&repeat);
    never.data = (void *)(long)iVar1;
    if (never.data == (void *)0x0) {
      iVar1 = uv_timer_start(&repeat,repeat_cb,100,100);
      never.data = (void *)(long)iVar1;
      if (never.data == (void *)0x0) {
        puVar2 = uv_default_loop();
        iVar1 = uv_timer_init(puVar2,&never);
        eval_b_3 = (int64_t)iVar1;
        eval_b_5 = 0;
        if ((void *)eval_b_3 == (void *)0x0) {
          iVar1 = uv_timer_start(&never,never_cb,100,100);
          eval_b_3 = (int64_t)iVar1;
          eval_b_5 = 0;
          if ((void *)eval_b_3 == (void *)0x0) {
            iVar1 = uv_timer_stop(&never);
            eval_b_3 = (int64_t)iVar1;
            eval_b_5 = 0;
            if ((void *)eval_b_3 == (void *)0x0) {
              uv_unref((uv_handle_t *)&never);
              puVar2 = uv_default_loop();
              uv_run(puVar2,UV_RUN_DEFAULT);
              eval_b_3 = 10;
              eval_b_5 = (int64_t)once_cb_called;
              if ((void *)eval_b_5 == (void *)0xa) {
                eval_b_3 = 10;
                eval_b_5 = (int64_t)once_close_cb_called;
                if ((void *)eval_b_5 == (void *)0xa) {
                  printf("repeat_cb_called %d\n",(ulong)(uint)repeat_cb_called);
                  eval_b_3 = 5;
                  eval_b_5 = (int64_t)repeat_cb_called;
                  if ((void *)eval_b_5 == (void *)0x5) {
                    eval_b_3 = 1;
                    eval_b_5 = (int64_t)repeat_close_cb_called;
                    if ((void *)eval_b_5 == (void *)0x1) {
                      eval_b_3 = 500;
                      puVar2 = uv_default_loop();
                      uVar6 = uv_now(puVar2);
                      eval_b_5 = uVar6 - start_time;
                      if (eval_b_5 < 500) {
                        pcVar7 = "<=";
                        pcVar5 = "uv_now(uv_default_loop()) - start_time";
                        pcVar4 = "500";
                        uVar3 = 0x9d;
                      }
                      else {
                        puVar2 = uv_default_loop();
                        close_loop(puVar2);
                        eval_b_3 = 0;
                        puVar2 = uv_default_loop();
                        iVar1 = uv_loop_close(puVar2);
                        eval_b_5 = (int64_t)iVar1;
                        if ((void *)eval_b_5 == (void *)0x0) {
                          uv_library_shutdown();
                          return 0;
                        }
                        pcVar7 = "==";
                        pcVar5 = "uv_loop_close(uv_default_loop())";
                        pcVar4 = "0";
                        uVar3 = 0x9f;
                      }
                    }
                    else {
                      pcVar7 = "==";
                      pcVar5 = "repeat_close_cb_called";
                      pcVar4 = "1";
                      uVar3 = 0x9b;
                    }
                  }
                  else {
                    pcVar7 = "==";
                    pcVar5 = "repeat_cb_called";
                    pcVar4 = "5";
                    uVar3 = 0x9a;
                  }
                }
                else {
                  pcVar7 = "==";
                  pcVar5 = "once_close_cb_called";
                  pcVar4 = "10";
                  uVar3 = 0x98;
                }
              }
              else {
                pcVar7 = "==";
                pcVar5 = "once_cb_called";
                pcVar4 = "10";
                uVar3 = 0x97;
              }
            }
            else {
              pcVar7 = "==";
              pcVar5 = "0";
              pcVar4 = "r";
              uVar3 = 0x92;
            }
          }
          else {
            pcVar7 = "==";
            pcVar5 = "0";
            pcVar4 = "r";
            uVar3 = 0x90;
          }
        }
        else {
          pcVar7 = "==";
          pcVar5 = "0";
          pcVar4 = "r";
          uVar3 = 0x8e;
        }
        goto LAB_00197a11;
      }
      uVar3 = 0x8a;
    }
    else {
      uVar3 = 0x88;
    }
    pcVar5 = "0";
    pcVar4 = "r";
    pcVar7 = "==";
    eval_b_3 = (int64_t)never.data;
    eval_b_5 = (int64_t)(void *)0x0;
  }
LAB_00197a11:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
          ,uVar3,pcVar4,pcVar7,pcVar5,eval_b_3,pcVar7,eval_b_5);
  abort();
}

Assistant:

TEST_IMPL(timer) {
  uv_timer_t once_timers[10];
  uv_timer_t *once;
  uv_timer_t repeat, never;
  unsigned int i;
  int r;

  start_time = uv_now(uv_default_loop());
  ASSERT_LT(0, start_time);

  /* Let 10 timers time out in 500 ms total. */
  for (i = 0; i < ARRAY_SIZE(once_timers); i++) {
    once = once_timers + i;
    r = uv_timer_init(uv_default_loop(), once);
    ASSERT_OK(r);
    r = uv_timer_start(once, once_cb, i * 50, 0);
    ASSERT_OK(r);
  }

  /* The 11th timer is a repeating timer that runs 4 times */
  r = uv_timer_init(uv_default_loop(), &repeat);
  ASSERT_OK(r);
  r = uv_timer_start(&repeat, repeat_cb, 100, 100);
  ASSERT_OK(r);

  /* The 12th timer should not do anything. */
  r = uv_timer_init(uv_default_loop(), &never);
  ASSERT_OK(r);
  r = uv_timer_start(&never, never_cb, 100, 100);
  ASSERT_OK(r);
  r = uv_timer_stop(&never);
  ASSERT_OK(r);
  uv_unref((uv_handle_t*)&never);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(10, once_cb_called);
  ASSERT_EQ(10, once_close_cb_called);
  printf("repeat_cb_called %d\n", repeat_cb_called);
  ASSERT_EQ(5, repeat_cb_called);
  ASSERT_EQ(1, repeat_close_cb_called);

  ASSERT_LE(500, uv_now(uv_default_loop()) - start_time);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}